

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall
pbrt::Image::SetChannels(Image *this,Point2i p,ImageChannelDesc *desc,span<const_float> values)

{
  int iVar1;
  char (*args_1) [12];
  size_t sVar2;
  undefined8 in_RCX;
  char (*in_RDX) [14];
  Image *unaff_RBX;
  undefined8 in_RSI;
  char *in_RDI;
  char *in_R8;
  Tuple2<pbrt::Point2,_int> unaff_retaddr;
  unsigned_long *in_stack_00000008;
  char (*in_stack_00000010) [12];
  int *in_stack_00000018;
  size_t i;
  int vb;
  size_t va;
  size_type in_stack_ffffffffffffff78;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *in_stack_ffffffffffffff80;
  ulong local_48;
  int line;
  
  line = (int)((ulong)in_RCX >> 0x20);
  args_1 = (char (*) [12])
           pstd::span<const_float>::size((span<const_float> *)&stack0xffffffffffffffe0);
  iVar1 = NChannels((Image *)0x4bdcd4);
  if ((char (*) [12])(long)iVar1 < args_1) {
    LogFatal<char_const(&)[14],char_const(&)[12],char_const(&)[14],unsigned_long&,char_const(&)[12],int&>
              ((LogLevel)((ulong)in_RSI >> 0x20),in_R8,line,in_RDI,in_RDX,args_1,
               (char (*) [14])unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018);
  }
  local_48 = 0;
  while( true ) {
    sVar2 = pstd::span<const_float>::size((span<const_float> *)&stack0xffffffffffffffe0);
    if (sVar2 <= local_48) break;
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::operator[]
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    pstd::span<const_float>::operator[]((span<const_float> *)&stack0xffffffffffffffe0,local_48);
    SetChannel(unaff_RBX,(Point2i)unaff_retaddr,(int)((ulong)in_RSI >> 0x20),(Float)in_RSI);
    local_48 = local_48 + 1;
  }
  return;
}

Assistant:

void Image::SetChannels(Point2i p, const ImageChannelDesc &desc,
                        pstd::span<const Float> values) {
    CHECK_LE(values.size(), NChannels());
    for (size_t i = 0; i < values.size(); ++i)
        SetChannel(p, desc.offset[i], values[i]);
}